

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

void __thiscall ON_wString::UrlEncode(ON_wString *this)

{
  uint uVar1;
  int iVar2;
  ON_Internal_Empty_wString *pOVar3;
  wchar_t *s;
  int *piVar4;
  wchar_t *__src;
  size_t __n;
  wchar_t *pwVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  CopyArray(this);
  pwVar5 = this->m_s;
  pOVar3 = (ON_Internal_Empty_wString *)(pwVar5 + -3);
  if (pwVar5 == (wchar_t *)0x0) {
    pOVar3 = &empty_wstring;
  }
  uVar1 = (pOVar3->header).string_length;
  if (0 < (int)uVar1) {
    if ((pOVar3->header).string_capacity < 1) {
      pwVar5 = (wchar_t *)0x0;
    }
    __n = 0;
    piVar4 = (int *)0x0;
    s = (wchar_t *)0x0;
    do {
      iVar2 = *(int *)((long)pwVar5 + __n);
      if (iVar2 == 0) break;
      if ((((iVar2 - 0x30U < 10) || (iVar2 - 0x61U < 0x1a)) || (iVar2 - 0x41U < 0x1a)) ||
         (0xff < iVar2)) {
        if (piVar4 == (int *)0x0) {
          piVar4 = (int *)0x0;
        }
        else {
          *piVar4 = iVar2;
          piVar4 = piVar4 + 1;
        }
      }
      else {
        if (piVar4 == (int *)0x0) {
          s = (wchar_t *)onmalloc((ulong)uVar1 * 0xc + 4);
          if (__n != 0) {
            CopyArray(this);
            __src = this->m_s;
            pOVar3 = (ON_Internal_Empty_wString *)(__src + -3);
            if (__src == (wchar_t *)0x0) {
              pOVar3 = &empty_wstring;
            }
            if ((pOVar3->header).string_capacity < 1) {
              __src = (wchar_t *)0x0;
            }
            memcpy(s,__src,__n);
          }
          piVar4 = (int *)((long)s + __n);
        }
        iVar6 = iVar2 + 0xf;
        if (-1 < iVar2) {
          iVar6 = iVar2;
        }
        *piVar4 = 0x25;
        iVar6 = (iVar6 >> 4) - (((uint)(iVar6 >> 0x1f) >> 0x1c) + (iVar6 >> 4) & 0xfffffff0);
        uVar7 = -(uint)(9 < iVar6);
        uVar8 = -(uint)(9 < iVar2 % 0x10);
        *(ulong *)(piVar4 + 1) =
             CONCAT44((uVar8 & 0x37 | ~uVar8 & 0x30) + iVar2 % 0x10,
                      (uVar7 & 0x37 | ~uVar7 & 0x30) + iVar6);
        piVar4 = piVar4 + 3;
      }
      __n = __n + 4;
    } while ((ulong)uVar1 << 2 != __n);
    if (piVar4 != (int *)0x0) {
      *piVar4 = 0;
      operator=(this,s);
      onfree(s);
      return;
    }
  }
  return;
}

Assistant:

void ON_wString::UrlEncode()
{
  wchar_t c, c0, c1;
  wchar_t* buffer = 0;
  wchar_t* s1 = 0;
  const wchar_t* s = Array();
  const int count = Length();
  int i;

  for ( i = 0; i < count; i++ )
  {
    c = *s++;
    if ( 0 == c )
      break;
    if ('0' <= c && c <= '9')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if ('a' <= c && c <= 'z')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if ('A' <= c && c <= 'Z')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if (c >= 256)
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }

    // convert this character to %xx
    if ( !s1 )
    {
      buffer = (wchar_t*)onmalloc((count*3 + 1)*sizeof(buffer[0]));
      if ( i > 0 )
        memcpy(buffer,Array(),i*sizeof(buffer[0]));
      s1 = buffer+i;
    }
    c0 = ((c/16)%16) + '0';
    if ( c0 > '9' )
      c0 += ('A'-'9'-1);
    c1 = (c%16) + '0';
    if ( c1 > '9' )
      c1 += ('A'-'9'-1);
    *s1++ = '%';
    *s1++ = c0;
    *s1++ = c1;
  }
  if ( s1 )
  {
    *s1 = 0;
    *this = buffer;
    onfree(buffer);
  }
}